

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rand.c
# Opt level: O2

CURLcode Curl_rand(Curl_easy *data,uchar *rnd,size_t num)

{
  CURLcode CVar1;
  undefined8 in_RAX;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  undefined4 uStack_38;
  uint r;
  
  CVar1 = CURLE_BAD_FUNCTION_ARGUMENT;
  _uStack_38 = in_RAX;
  while( true ) {
    if (num == 0) {
      return CVar1;
    }
    uVar3 = 4;
    if (num < 4) {
      uVar3 = num;
    }
    CVar1 = randit(data,&r);
    uVar2 = uVar3;
    if (CVar1 != CURLE_OK) break;
    while (bVar4 = uVar2 != 0, uVar2 = uVar2 - 1, bVar4) {
      *rnd = (uchar)r;
      rnd = rnd + 1;
      _uStack_38 = CONCAT44(r >> 8,uStack_38);
    }
    num = num - uVar3;
    CVar1 = CURLE_OK;
  }
  return CVar1;
}

Assistant:

CURLcode Curl_rand(struct Curl_easy *data, unsigned char *rnd, size_t num)
{
  CURLcode result = CURLE_BAD_FUNCTION_ARGUMENT;

  DEBUGASSERT(num);

  while(num) {
    unsigned int r;
    size_t left = num < sizeof(unsigned int) ? num : sizeof(unsigned int);

    result = randit(data, &r);
    if(result)
      return result;

    while(left) {
      *rnd++ = (unsigned char)(r & 0xFF);
      r >>= 8;
      --num;
      --left;
    }
  }

  return result;
}